

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O3

sexp_conflict
sexp_set_socket_option_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2,sexp_conflict arg3)

{
  int __level;
  int __optname;
  int iVar1;
  sexp_conflict psVar2;
  undefined8 uVar3;
  int tmp3;
  undefined1 local_4 [4];
  
  if (((ulong)arg0 & 3) == 0) {
    if (arg0->tag == 0x12) goto LAB_001026eb;
  }
  else if (((ulong)arg0 & 1) != 0) {
LAB_001026eb:
    if ((((ulong)arg1 & 1) == 0) && ((((ulong)arg1 & 2) != 0 || (arg1->tag != 0xc)))) {
      uVar3 = 2;
      arg0 = arg1;
    }
    else if ((((ulong)arg2 & 1) == 0) && ((((ulong)arg2 & 2) != 0 || (arg2->tag != 0xc)))) {
      uVar3 = 2;
      arg0 = arg2;
    }
    else {
      if ((((ulong)arg3 & 1) != 0) || ((((ulong)arg3 & 2) == 0 && (arg3->tag == 0xc)))) {
        if ((((ulong)arg0 & 3) == 0) && (arg0->tag == 0x12)) {
          iVar1 = (int)(arg0->value).fileno.fd;
        }
        else {
          iVar1 = (int)((long)arg0 >> 1);
        }
        if (((ulong)arg1 & 1) == 0) {
          if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
            __level = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
          }
          else {
            __level = 0;
          }
        }
        else {
          __level = (int)((long)arg1 >> 1);
        }
        if (((ulong)arg2 & 1) == 0) {
          if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
            __optname = (int)(arg2->value).flonum_bits[0] * (int)(arg2->value).uvector.length;
          }
          else {
            __optname = 0;
          }
        }
        else {
          __optname = (int)((long)arg2 >> 1);
        }
        iVar1 = setsockopt(iVar1,__level,__optname,local_4,4);
        return (sexp_conflict)((ulong)(iVar1 == 0) << 8 | 0x3e);
      }
      uVar3 = 2;
      arg0 = arg3;
    }
    goto LAB_00102782;
  }
  uVar3 = 0x12;
LAB_00102782:
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,uVar3,arg0);
  return psVar2;
}

Assistant:

sexp sexp_set_socket_option_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2, sexp arg3) {
  int err = 0;
  int tmp3;
  sexp res;
  if (! (sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (! sexp_exact_integerp(arg3))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg3);
  tmp3 = sexp_sint_value(arg3);
  err = setsockopt((sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), sexp_sint_value(arg1), sexp_sint_value(arg2), &tmp3, sizeof(int));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}